

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util_unittest.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::StringUtilTest_FindAndReplace_Test::TestBody
          (StringUtilTest_FindAndReplace_Test *this)

{
  string_view replace;
  string_view replace_00;
  string_view replace_01;
  string_view replace_02;
  char *pcVar1;
  char *in_R9;
  string_view find;
  string_view find_00;
  string_view find_01;
  string_view find_02;
  string_view find_03;
  string_view find_04;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  AssertHelper local_c8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  AssertionResult gtest_ar;
  string tester;
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tester,"hoobla derp hoobla derp porkrind",(allocator<char> *)&gtest_ar);
  replace._M_str = "woof";
  replace._M_len = 4;
  find._M_str = in_R9;
  find._M_len = (size_t)"blah";
  str._M_str = &DAT_00000004;
  str._M_len = (size_t)tester._M_dataplus._M_p;
  string_util::FindAndReplace_abi_cxx11_
            ((string *)&gtest_ar,(string_util *)tester._M_string_length,str,find,replace);
  ::std::__cxx11::string::operator=((string *)&tester,(string *)&gtest_ar);
  ::std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[33]>
            ((internal *)&gtest_ar,"tester","\"hoobla derp hoobla derp porkrind\"",&tester,
             (char (*) [33])"hoobla derp hoobla derp porkrind");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x4a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pcVar1 = "";
  replace_00._M_str = "yeet";
  replace_00._M_len = 4;
  find_00._M_str = in_R9;
  find_00._M_len = (size_t)"";
  str_00._M_str = (char *)0x0;
  str_00._M_len = (size_t)tester._M_dataplus._M_p;
  string_util::FindAndReplace_abi_cxx11_
            ((string *)&gtest_ar,(string_util *)tester._M_string_length,str_00,find_00,replace_00);
  ::std::__cxx11::string::operator=((string *)&tester,(string *)&gtest_ar);
  ::std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[33]>
            ((internal *)&gtest_ar,"tester","\"hoobla derp hoobla derp porkrind\"",&tester,
             (char (*) [33])"hoobla derp hoobla derp porkrind");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x4c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  replace_01._M_str = "derp";
  replace_01._M_len = 4;
  find_01._M_str = in_R9;
  find_01._M_len = (size_t)"hoobla";
  str_01._M_str = (char *)0x6;
  str_01._M_len = (size_t)tester._M_dataplus._M_p;
  string_util::FindAndReplace_abi_cxx11_
            ((string *)&gtest_ar,(string_util *)tester._M_string_length,str_01,find_01,replace_01);
  ::std::__cxx11::string::operator=((string *)&tester,(string *)&gtest_ar);
  ::std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[29]>
            ((internal *)&gtest_ar,"tester","\"derp derp derp derp porkrind\"",&tester,
             (char (*) [29])"derp derp derp derp porkrind");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x4e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  replace_02._M_str = "a";
  replace_02._M_len = 1;
  find_02._M_str = in_R9;
  find_02._M_len = (size_t)"derp";
  str_02._M_str = &DAT_00000004;
  str_02._M_len = (size_t)tester._M_dataplus._M_p;
  string_util::FindAndReplace_abi_cxx11_
            ((string *)&gtest_ar,(string_util *)tester._M_string_length,str_02,find_02,replace_02);
  ::std::__cxx11::string::operator=((string *)&tester,(string *)&gtest_ar);
  ::std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[17]>
            ((internal *)&gtest_ar,"tester","\"a a a a porkrind\"",&tester,
             (char (*) [17])"a a a a porkrind");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x50,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pcVar1 = "";
  find_03._M_str = in_R9;
  find_03._M_len = (size_t)"a ";
  str_03._M_str = (char *)0x2;
  str_03._M_len = (size_t)tester._M_dataplus._M_p;
  string_util::FindAndReplace_abi_cxx11_
            ((string *)&gtest_ar,(string_util *)tester._M_string_length,str_03,find_03,
             (string_view)(ZEXT816(0x43f510) << 0x40));
  ::std::__cxx11::string::operator=((string *)&tester,(string *)&gtest_ar);
  ::std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)&gtest_ar,"tester","\"porkrind\"",&tester,(char (*) [9])0x443a5f);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x52,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  find_04._M_str = in_R9;
  find_04._M_len = (size_t)"porkrind";
  str_04._M_str = &DAT_00000008;
  str_04._M_len = (size_t)tester._M_dataplus._M_p;
  string_util::FindAndReplace_abi_cxx11_
            ((string *)&gtest_ar,(string_util *)tester._M_string_length,str_04,find_04,
             (string_view)(ZEXT816(0x43f510) << 0x40));
  ::std::__cxx11::string::operator=((string *)&tester,(string *)&gtest_ar);
  ::std::__cxx11::string::~string((string *)&gtest_ar);
  pcVar1 = "";
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
            ((internal *)&gtest_ar,"tester","\"\"",&tester,(char (*) [1])"");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x54,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  ::std::__cxx11::string::~string((string *)&tester);
  return;
}

Assistant:

TEST(StringUtilTest, FindAndReplace) {
  std::string tester = "hoobla derp hoobla derp porkrind";
  tester = bssl::string_util::FindAndReplace(tester, "blah", "woof");
  EXPECT_EQ(tester, "hoobla derp hoobla derp porkrind");
  tester = bssl::string_util::FindAndReplace(tester, "", "yeet");
  EXPECT_EQ(tester, "hoobla derp hoobla derp porkrind");
  tester = bssl::string_util::FindAndReplace(tester, "hoobla", "derp");
  EXPECT_EQ(tester, "derp derp derp derp porkrind");
  tester = bssl::string_util::FindAndReplace(tester, "derp", "a");
  EXPECT_EQ(tester, "a a a a porkrind");
  tester = bssl::string_util::FindAndReplace(tester, "a ", "");
  EXPECT_EQ(tester, "porkrind");
  tester = bssl::string_util::FindAndReplace(tester, "porkrind", "");
  EXPECT_EQ(tester, "");
}